

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O3

void __thiscall
asmjit::JitAllocatorBlock::markShrunkArea
          (JitAllocatorBlock *this,uint32_t shrunkAreaStart,uint32_t shrunkAreaEnd)

{
  size_t *psVar1;
  BitWord *pBVar2;
  byte bVar3;
  JitAllocatorBlock *pJVar4;
  uint uVar5;
  ulong uVar6;
  JitAllocatorBlock *pJVar7;
  JitAllocatorBlock *pJVar8;
  ulong uVar9;
  JitAllocatorBlock *pJVar10;
  uintptr_t *puVar11;
  undefined4 in_register_00000034;
  JitAllocatorBlock *params;
  JitAllocatorBlock *pJVar12;
  JitAllocatorBlock *pJVar13;
  ulong *puVar14;
  byte *pbVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  uintptr_t uVar19;
  ulong *puVar20;
  ulong uVar21;
  byte *pbVar22;
  ulong *puVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  uintptr_t uStack_c8;
  byte *pbStack_c0;
  JitAllocatorBlock *pJStack_b8;
  uintptr_t uStack_78;
  JitAllocatorBlock *pJStack_70;
  
  params = (JitAllocatorBlock *)CONCAT44(in_register_00000034,shrunkAreaStart);
  if (shrunkAreaStart == 0) {
    markShrunkArea();
  }
  else {
    uVar16 = shrunkAreaEnd - shrunkAreaStart;
    uVar17 = (ulong)uVar16;
    if (uVar16 != 0) {
      psVar1 = &this->_pool->totalAreaUsed;
      *psVar1 = *psVar1 - uVar17;
      this->_areaUsed = this->_areaUsed - uVar16;
      uVar16 = this->_searchStart;
      if (shrunkAreaStart < this->_searchStart) {
        uVar16 = shrunkAreaStart;
      }
      uVar5 = this->_searchEnd;
      if (this->_searchEnd <= shrunkAreaEnd) {
        uVar5 = shrunkAreaEnd;
      }
      this->_searchStart = uVar16;
      this->_searchEnd = uVar5;
      pBVar2 = this->_usedBitVector;
      uVar9 = 0x40 - (ulong)(shrunkAreaStart & 0x3f);
      if (uVar17 < uVar9) {
        uVar9 = uVar17;
      }
      puVar23 = pBVar2 + (shrunkAreaStart >> 6);
      puVar20 = puVar23 + 1;
      *puVar23 = *puVar23 &
                 ~((0xffffffffffffffffU >> (-(char)uVar9 & 0x3fU)) <<
                  (sbyte)(shrunkAreaStart & 0x3f));
      uVar6 = uVar17 - uVar9;
      if (0x3f < uVar6) {
        uVar17 = (uVar17 - uVar9) - 0x40;
        uVar9 = uVar17 >> 6;
        memset(puVar20,0,uVar9 * 8 + 8);
        uVar6 = (ulong)((uint)uVar17 & 0x3f);
        puVar20 = pBVar2 + (ulong)(shrunkAreaStart >> 6) + uVar9 + 2;
      }
      if (uVar6 != 0) {
        *puVar20 = *puVar20 & ~(0xffffffffffffffffU >> (-(char)uVar6 & 0x3fU));
      }
      pBVar2 = this->_stopBitVector;
      bVar3 = (byte)(shrunkAreaEnd - 1) & 0x3f;
      puVar23 = pBVar2 + (shrunkAreaEnd - 1 >> 6);
      *puVar23 = *puVar23 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      puVar23 = pBVar2 + (shrunkAreaStart - 1 >> 6);
      *puVar23 = *puVar23 | 1L << ((byte)(shrunkAreaStart - 1) & 0x3f);
      *(byte *)&this->_flags = (byte)this->_flags | 2;
      return;
    }
  }
  markShrunkArea();
  uVar17 = (params->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData
           [0];
  if (uVar17 < 2) {
    if ((params->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData[1]
        != 0) goto LAB_0011a53e;
    if (uVar17 == 0) {
      pJVar7 = (JitAllocatorBlock *)
               (this->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData
               [0];
      if (pJVar7 == (JitAllocatorBlock *)0x0) {
        (this->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData[0] =
             (uintptr_t)params;
      }
      else {
        pJVar4 = (JitAllocatorBlock *)&uStack_78;
        uStack_78 = 0;
        pJStack_70 = pJVar7;
        (params->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData[0] =
             1;
        pJVar10 = (JitAllocatorBlock *)0x0;
        pJVar12 = (JitAllocatorBlock *)0x0;
        uVar17 = 0;
        uVar9 = 0;
        while( true ) {
          uVar6 = uVar17;
          if (pJVar7 == (JitAllocatorBlock *)0x0) {
            (pJVar12->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData
            [uVar6] = (ulong)((uint)(pJVar12->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).
                                    super_ZoneTreeNode._rbNodeData[uVar6] & 1) | (ulong)params;
            pJVar13 = params;
          }
          else {
            uVar17 = (pJVar7->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                     _rbNodeData[0];
            pbVar15 = (byte *)(uVar17 & 0xfffffffffffffffe);
            pJVar13 = pJVar7;
            if ((((pbVar15 != (byte *)0x0) && ((*pbVar15 & 1) != 0)) &&
                (pbVar22 = (byte *)(pJVar7->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).
                                   super_ZoneTreeNode._rbNodeData[1], pbVar22 != (byte *)0x0)) &&
               ((*pbVar22 & 1) != 0)) {
              (pJVar7->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
              _rbNodeData[0] = uVar17 | 1;
              *pbVar15 = *pbVar15 & 0xfe;
              puVar23 = (ulong *)(pJVar7->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).
                                 super_ZoneTreeNode._rbNodeData[1];
              *puVar23 = *puVar23 & 0xfffffffffffffffe;
            }
          }
          if (((pJVar12 != (JitAllocatorBlock *)0x0) &&
              (((pJVar13->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                _rbNodeData[0] & 1) != 0)) &&
             (((pJVar12->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
               _rbNodeData[0] & 1) != 0)) {
            bVar24 = pJVar10 ==
                     (JitAllocatorBlock *)
                     (pJVar4->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                     _rbNodeData[1];
            bVar25 = uVar9 == 0;
            bVar26 = !bVar25;
            uVar17 = (pJVar10->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                     _rbNodeData[bVar26];
            pbVar15 = (byte *)(uVar17 & 0xfffffffffffffffe);
            pbVar22 = (byte *)(*(ulong *)(pbVar15 + (ulong)bVar25 * 8) & 0xfffffffffffffffe);
            if (pJVar13 ==
                (JitAllocatorBlock *)
                ((pJVar12->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                 _rbNodeData[uVar9] & 0xfffffffffffffffe)) {
              puVar23 = (ulong *)(pbVar15 + (ulong)bVar25 * 8);
              uVar19 = (ulong)pbVar22 | (ulong)((uint)uVar17 & 1);
            }
            else {
              uVar9 = (ulong)((uint)bVar26 * 8);
              lVar18 = (ulong)bVar25 * 8;
              *(ulong *)(pbVar15 + lVar18) =
                   (ulong)((uint)*(ulong *)(pbVar15 + (ulong)bVar25 * 8) & 1) |
                   *(ulong *)(pbVar22 + uVar9) & 0xfffffffffffffffe;
              *(ulong *)(pbVar22 + uVar9) =
                   (ulong)((uint)*(undefined8 *)(pbVar22 + uVar9) & 1) | (ulong)pbVar15;
              *pbVar15 = *pbVar15 | 1;
              *pbVar22 = *pbVar22 & 0xfe;
              uVar17 = (ulong)((uint)*(undefined8 *)
                                      ((long)(pJVar10->
                                             super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).
                                             super_ZoneTreeNode._rbNodeData + uVar9) & 1);
              *(ulong *)((long)(pJVar10->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).
                               super_ZoneTreeNode._rbNodeData + uVar9) = uVar17 | (ulong)pbVar22;
              puVar23 = (ulong *)(pbVar22 + lVar18);
              uVar19 = *(ulong *)(pbVar22 + lVar18) & 0xfffffffffffffffe | uVar17;
              pbVar15 = pbVar22;
            }
            (pJVar10->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData
            [bVar26] = uVar19;
            *puVar23 = (ulong)((uint)*puVar23 & 1) | (ulong)pJVar10;
            *(byte *)(pJVar10->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                     _rbNodeData =
                 (byte)(pJVar10->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                       _rbNodeData[0] | 1;
            *pbVar15 = *pbVar15 & 0xfe;
            (pJVar4->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData
            [bVar24] = (ulong)((uint)(pJVar4->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).
                                     super_ZoneTreeNode._rbNodeData[bVar24] & 1) | (ulong)pbVar15;
          }
          if (pJVar13 == params) break;
          uVar17 = (ulong)((pJVar13->_mapping).ro < (params->_mapping).ro);
          if (pJVar10 != (JitAllocatorBlock *)0x0) {
            pJVar4 = pJVar10;
          }
          pJVar7 = (JitAllocatorBlock *)
                   ((pJVar13->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                    _rbNodeData[uVar17] & 0xfffffffffffffffe);
          pJVar10 = pJVar12;
          pJVar12 = pJVar13;
          uVar9 = uVar6;
        }
        (this->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData[0] =
             (uintptr_t)pJStack_70;
        *(byte *)(pJStack_70->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                 _rbNodeData =
             (byte)(pJStack_70->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                   _rbNodeData[0] & 0xfe;
      }
      return;
    }
  }
  else {
    ZoneTree<asmjit::JitAllocatorBlock>::insert<asmjit::Support::Compare<0u>>();
LAB_0011a53e:
    ZoneTree<asmjit::JitAllocatorBlock>::insert<asmjit::Support::Compare<0u>>();
  }
  ZoneTree<asmjit::JitAllocatorBlock>::insert<asmjit::Support::Compare<0u>>();
  uStack_c8 = 0;
  pJStack_b8 = this;
  pbVar15 = (byte *)(this->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                    _rbNodeData[0];
  pbStack_c0 = pbVar15;
  if (pbVar15 < (byte *)0x2) goto LAB_0011a8d4;
  puVar11 = (uintptr_t *)&pbStack_c0;
  this = (JitAllocatorBlock *)(params->_mapping).ro;
  pJVar4 = (JitAllocatorBlock *)0x0;
  pJVar7 = (JitAllocatorBlock *)0x0;
  uVar17 = 1;
  pJVar10 = (JitAllocatorBlock *)&uStack_c8;
  pJVar12 = (JitAllocatorBlock *)0x0;
  do {
    pJVar8 = (JitAllocatorBlock *)((ulong)pbVar15 & 0xfffffffffffffffe);
    pJVar13 = (JitAllocatorBlock *)(pJVar8->_mapping).ro;
    uVar16 = (uint)(pJVar13 >= this && pJVar13 != this) - (uint)(pJVar13 < this);
    uVar9 = (ulong)(uVar16 >> 0x1f);
    if (pJVar8 == params) {
      pJVar4 = pJVar8;
      pJVar7 = pJVar12;
    }
    pJVar13 = pJVar10;
    if ((((pJVar8->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData[0]
         & 1) == 0) &&
       ((pbVar15 = (byte *)((pJVar8->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).
                            super_ZoneTreeNode._rbNodeData[uVar9] & 0xfffffffffffffffe),
        pbVar15 == (byte *)0x0 || ((*pbVar15 & 1) == 0)))) {
      uVar6 = (pJVar8->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
              _rbNodeData[-1 < (int)uVar16];
      pJVar13 = (JitAllocatorBlock *)(uVar6 & 0xfffffffffffffffe);
      if ((pJVar13 == (JitAllocatorBlock *)0x0) ||
         (((pJVar13->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData
           [0] & 1) == 0)) {
        bVar26 = uVar17 == 0;
        uVar6 = (pJVar10->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                _rbNodeData[bVar26];
        puVar23 = (ulong *)(uVar6 & 0xfffffffffffffffe);
        pJVar13 = pJVar10;
        if (puVar23 != (ulong *)0x0) {
          pbVar15 = (byte *)(puVar23[bVar26] & 0xfffffffffffffffe);
          if ((pbVar15 == (byte *)0x0) || ((*pbVar15 & 1) == 0)) {
            pbVar22 = (byte *)(puVar23[uVar17] & 0xfffffffffffffffe);
            if ((pbVar22 == (byte *)0x0) || ((*pbVar22 & 1) == 0)) {
              *(byte *)(pJVar10->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                       _rbNodeData =
                   (byte)(pJVar10->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).
                         super_ZoneTreeNode._rbNodeData[0] & 0xfe;
              *(byte *)puVar23 = (byte)*puVar23 | 1;
              *(byte *)(pJVar8->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                       _rbNodeData =
                   (byte)(pJVar8->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode
                         ._rbNodeData[0] | 1;
              goto LAB_0011a7ac;
            }
            puVar11 = (pJVar12->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                      _rbNodeData +
                      (pJVar10 ==
                      (JitAllocatorBlock *)
                      (pJVar12->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                      _rbNodeData[1]);
            if ((*pbVar22 & 1) != 0) goto LAB_0011a6d5;
            puVar20 = (ulong *)(*puVar11 & 0xfffffffffffffffe);
            if (pbVar15 != (byte *)0x0) goto LAB_0011a74c;
          }
          else {
            puVar11 = (pJVar12->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                      _rbNodeData +
                      (pJVar10 ==
                      (JitAllocatorBlock *)
                      (pJVar12->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                      _rbNodeData[1]);
            puVar20 = (ulong *)(*puVar11 & 0xfffffffffffffffe);
            pbVar22 = (byte *)(puVar23[uVar17] & 0xfffffffffffffffe);
            if (pbVar22 == (byte *)0x0) {
              pbVar22 = (byte *)0x0;
LAB_0011a74c:
              if ((*pbVar15 & 1) == 0) goto LAB_0011a786;
              puVar14 = puVar23 + uVar17;
              uVar19 = (ulong)pbVar22 | (ulong)((uint)uVar6 & 1);
              puVar20 = puVar23;
            }
            else {
              if ((*pbVar22 & 1) == 0) goto LAB_0011a74c;
LAB_0011a6d5:
              puVar20 = (ulong *)(puVar23[uVar17 != 0] & 0xfffffffffffffffe);
              uVar6 = (ulong)((uint)bVar26 * 8);
              puVar23[uVar17 != 0] =
                   (ulong)((uint)puVar23[uVar17 != 0] & 1) |
                   *(ulong *)((long)puVar20 + uVar6) & 0xfffffffffffffffe;
              *(ulong *)((long)puVar20 + uVar6) =
                   (ulong)((uint)*(undefined8 *)((long)puVar20 + uVar6) & 1) | (ulong)puVar23;
              *(byte *)puVar23 = (byte)*puVar23 | 1;
              *(byte *)puVar20 = (byte)*puVar20 & 0xfe;
              uVar21 = (ulong)((uint)*(undefined8 *)
                                      ((long)(pJVar10->
                                             super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).
                                             super_ZoneTreeNode._rbNodeData + uVar6) & 1);
              *(byte **)((long)(pJVar10->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).
                               super_ZoneTreeNode._rbNodeData + uVar6) =
                   (byte *)(uVar21 + (long)puVar20);
              puVar14 = puVar20 + uVar17;
              uVar19 = *puVar14 & 0xfffffffffffffffe | uVar21;
            }
            (pJVar10->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData
            [bVar26] = uVar19;
            *puVar14 = (ulong)((uint)*puVar14 & 1) | (ulong)pJVar10;
            *(byte *)(pJVar10->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                     _rbNodeData =
                 (byte)(pJVar10->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                       _rbNodeData[0] | 1;
            *(byte *)puVar20 = (byte)*puVar20 & 0xfe;
            *puVar11 = (ulong)((uint)*puVar11 & 1) | (ulong)puVar20;
          }
LAB_0011a786:
          *(byte *)(pJVar8->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                   _rbNodeData =
               (byte)(pJVar8->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                     _rbNodeData[0] | 1;
          uVar17 = *puVar20;
          *puVar20 = uVar17 | 1;
          pbVar15 = (byte *)(uVar17 & 0xfffffffffffffffe);
          *pbVar15 = *pbVar15 & 0xfe;
          *(ulong *)puVar20[1] = *(ulong *)puVar20[1] & 0xfffffffffffffffe;
        }
      }
      else {
        (pJVar8->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData
        [-1 < (int)uVar16] =
             (ulong)((uint)uVar6 & 1) |
             (pJVar13->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
             _rbNodeData[uVar9] & 0xfffffffffffffffe;
        (pJVar13->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData
        [uVar9] = (ulong)((uint)(pJVar13->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).
                                super_ZoneTreeNode._rbNodeData[uVar9] & 1) | (ulong)pJVar8;
        *(byte *)(pJVar8->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                 _rbNodeData =
             (byte)(pJVar8->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                   _rbNodeData[0] | 1;
        *(byte *)(pJVar13->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                 _rbNodeData =
             (byte)(pJVar13->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                   _rbNodeData[0] & 0xfe;
        *puVar11 = (uintptr_t)((ulong)((uint)(byte *)*puVar11 & 1) | (ulong)pJVar13);
      }
    }
LAB_0011a7ac:
    puVar11 = (pJVar8->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
              _rbNodeData + uVar9;
    pbVar15 = (byte *)*puVar11;
    uVar17 = uVar9;
    pJVar10 = pJVar8;
    pJVar12 = pJVar13;
  } while ((byte *)0x1 < pbVar15);
  if (pJVar4 == (JitAllocatorBlock *)0x0) goto LAB_0011a8d4;
  this = (JitAllocatorBlock *)&uStack_c8;
  if (pJVar4 == this) {
LAB_0011a8c5:
    ZoneTree<asmjit::JitAllocatorBlock>::remove<asmjit::Support::Compare<0u>>();
LAB_0011a8ca:
    ZoneTree<asmjit::JitAllocatorBlock>::remove<asmjit::Support::Compare<0u>>();
  }
  else {
    if (this == pJVar8) goto LAB_0011a8ca;
    bVar26 = pJVar8 == (JitAllocatorBlock *)
                       (pJVar13->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                       _rbNodeData[1];
    (pJVar13->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData[bVar26]
         = (ulong)((uint)(pJVar13->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).
                         super_ZoneTreeNode._rbNodeData[bVar26] & 1) |
           (pJVar8->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData
           [(pJVar8->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData
            [0] < 2] & 0xfffffffffffffffe;
    if (pJVar4 == pJVar8) {
LAB_0011a89c:
      (pJStack_b8->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData[0]
           = (uintptr_t)pbStack_c0;
      if (pbStack_c0 != (byte *)0x0) {
        *pbStack_c0 = *pbStack_c0 & 0xfe;
      }
      return;
    }
    if (pJVar4 != pJVar7) {
      pJVar10 = pJVar7;
      if (pJVar7 == (JitAllocatorBlock *)0x0) {
        pJVar10 = this;
      }
      if (pJVar10 == this) {
        uVar17 = 1;
      }
      else {
        if (pJVar7 != (JitAllocatorBlock *)0x0) {
          this = pJVar7;
        }
        uVar17 = (ulong)((this->_mapping).ro < (params->_mapping).ro);
      }
      this = (JitAllocatorBlock *)
             (pJVar10->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
             _rbNodeData[uVar17];
      while (pJVar7 = (JitAllocatorBlock *)((ulong)this & 0xfffffffffffffffe), pJVar4 != pJVar7) {
        if (pJVar7 == (JitAllocatorBlock *)0x0) {
          ZoneTree<asmjit::JitAllocatorBlock>::remove<asmjit::Support::Compare<0u>>();
          goto LAB_0011a8c5;
        }
        uVar17 = (ulong)((pJVar7->_mapping).ro < (params->_mapping).ro);
        pJVar10 = pJVar7;
        this = (JitAllocatorBlock *)
               (pJVar7->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
               _rbNodeData[uVar17];
      }
      (pJVar10->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData
      [uVar17] = (ulong)((uint)this & 1) | (ulong)pJVar8;
      (pJVar8->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData[0] =
           (pJVar4->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData
           [0];
      (pJVar8->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData[1] =
           (pJVar4->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData
           [1];
      goto LAB_0011a89c;
    }
  }
  ZoneTree<asmjit::JitAllocatorBlock>::remove<asmjit::Support::Compare<0u>>();
LAB_0011a8d4:
  ZoneTree<asmjit::JitAllocatorBlock>::remove<asmjit::Support::Compare<0u>>();
  Target::Target((Target *)this);
  (this->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData[0] =
       (uintptr_t)&PTR__JitRuntime_00154750;
  JitAllocator::JitAllocator
            ((JitAllocator *)&this->super_ZoneListNode<asmjit::JitAllocatorBlock>,
             (CreateParams *)params);
  (this->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData[1] =
       0x10203000002;
  return;
}

Assistant:

inline void markShrunkArea(uint32_t shrunkAreaStart, uint32_t shrunkAreaEnd) noexcept {
    uint32_t shrunkAreaSize = shrunkAreaEnd - shrunkAreaStart;

    // Shrunk area cannot start at zero as it would mean that we have shrunk the first
    // block to zero bytes, which is not allowed as such block must be released instead.
    ASMJIT_ASSERT(shrunkAreaStart != 0);
    ASMJIT_ASSERT(shrunkAreaSize != 0);

    // Update the search region and statistics.
    _pool->totalAreaUsed -= shrunkAreaSize;
    _areaUsed -= shrunkAreaSize;
    _searchStart = Support::min(_searchStart, shrunkAreaStart);
    _searchEnd = Support::max(_searchEnd, shrunkAreaEnd);

    // Unmark the released space and move the sentinel.
    Support::bitVectorClear(_usedBitVector, shrunkAreaStart, shrunkAreaSize);
    Support::bitVectorSetBit(_stopBitVector, shrunkAreaEnd - 1, false);
    Support::bitVectorSetBit(_stopBitVector, shrunkAreaStart - 1, true);

    addFlags(kFlagDirty);
  }